

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

longlong __thiscall
ImGui::RoundScalarWithFormatT<long_long,long_long>
          (ImGui *this,char *format,ImGuiDataType data_type,longlong v)

{
  char *pcVar1;
  ImGui IVar2;
  ImGui *pIVar3;
  undefined4 in_register_00000014;
  int iVar4;
  char *src;
  double dVar5;
  char v_str [64];
  undefined8 local_50;
  char local_48 [64];
  
  local_50 = CONCAT44(in_register_00000014,data_type);
  do {
    IVar2 = *this;
    if (IVar2 == (ImGui)0x0) {
      iVar4 = 3;
      pIVar3 = (ImGui *)v;
    }
    else if ((IVar2 != (ImGui)0x25) || (iVar4 = 1, pIVar3 = this, this[1] == (ImGui)0x25)) {
      this = this + (ulong)(IVar2 == (ImGui)0x25) + 1;
      iVar4 = 0;
      pIVar3 = (ImGui *)v;
    }
    v = (longlong)pIVar3;
  } while (iVar4 == 0);
  if (iVar4 == 1) {
    this = pIVar3;
  }
  if ((*this == (ImGui)0x25) && (this[1] != (ImGui)0x25)) {
    ImFormatString(local_48,0x40,(char *)this,local_50);
    src = (char *)((long)&local_50 + 7);
    do {
      pcVar1 = src + 1;
      src = src + 1;
    } while (*pcVar1 == ' ');
    if (((uint)format & 0xfffffffe) == 4) {
      dVar5 = atof(src);
      local_50 = (longlong)dVar5;
    }
    else {
      ImAtoi<long_long>(src,&local_50);
    }
  }
  return local_50;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}